

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddPolyline
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,bool closed,float thickness)

{
  undefined1 (*pauVar1) [32];
  ImVec4 *pIVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ImVec2 IVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  ImDrawVert *pIVar10;
  ImVec4 *pIVar11;
  ImDrawIdx IVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  undefined1 (*pauVar19) [16];
  ImU32 IVar20;
  int iVar21;
  ulong uVar22;
  char cVar23;
  ImDrawIdx *pIVar24;
  undefined7 in_register_00000081;
  short sVar25;
  long lVar26;
  undefined8 *puVar27;
  ImDrawIdx IVar28;
  uint uVar29;
  uint uVar30;
  ImVec2 IVar31;
  int iVar32;
  bool bVar33;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar34;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar35;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  float fVar62;
  undefined8 uVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  float fVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  float fVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined8 uStack_d0;
  undefined1 local_c8 [16];
  uint local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined1 local_a8 [16];
  ImVec2 local_90;
  ImVec2 *local_88;
  undefined4 local_7c;
  int local_78;
  int local_74;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  undefined1 local_58 [16];
  float local_48;
  float local_44;
  ulong local_40;
  ImU32 local_38;
  byte local_31;
  
  local_58._8_8_ = local_58._0_8_;
  auVar44._4_60_ = in_register_00001204;
  auVar44._0_4_ = thickness;
  if (1 < points_count) {
    IVar31 = this->_Data->TexUvWhitePixel;
    local_60 = (ulong)(points_count - 1U);
    local_7c = (undefined4)CONCAT71(in_register_00000081,closed);
    uVar13 = points_count - 1U;
    if (closed) {
      uVar13 = points_count;
    }
    local_48 = thickness;
    local_38 = col;
    if ((this->Flags & 1U) == 0) {
      uStack_d0 = 0x187caf;
      PrimReserve(this,uVar13 * 6,uVar13 * 4);
      if (0 < (int)uVar13) {
        fVar35 = local_48 * 0.5;
        local_40 = CONCAT44(local_40._4_4_,fVar35);
        uVar15 = 1;
        IVar20 = local_38;
        local_90 = IVar31;
        local_88 = points;
        do {
          uVar16 = uVar15;
          if ((uint)points_count == uVar15) {
            uVar16 = 0;
          }
          auVar36._8_8_ = 0;
          auVar36._0_4_ = points[uVar16].x;
          auVar36._4_4_ = points[uVar16].y;
          auVar45._8_8_ = 0;
          auVar45._0_4_ = points[uVar15 - 1].x;
          auVar45._4_4_ = points[uVar15 - 1].y;
          auVar49 = vsubps_avx(auVar36,auVar45);
          fVar34 = auVar49._0_4_;
          auVar37._0_4_ = fVar34 * fVar34;
          auVar37._4_4_ = auVar49._4_4_ * auVar49._4_4_;
          auVar37._8_4_ = auVar49._8_4_ * auVar49._8_4_;
          auVar37._12_4_ = auVar49._12_4_ * auVar49._12_4_;
          auVar64 = vmovshdup_avx(auVar37);
          fVar34 = fVar34 * fVar34 + auVar64._0_4_;
          if (0.0 < fVar34) {
            local_58 = auVar49;
            if (fVar34 < 0.0) {
              uStack_d0 = 0x187d3f;
              fVar34 = sqrtf(fVar34);
              IVar31 = local_90;
              points = local_88;
              IVar20 = local_38;
              fVar35 = (float)local_40;
            }
            else {
              auVar64 = vsqrtss_avx(ZEXT416((uint)fVar34),ZEXT416((uint)fVar34));
              fVar34 = auVar64._0_4_;
            }
            fVar34 = 1.0 / fVar34;
            auVar49._0_4_ = local_58._0_4_ * fVar34;
            auVar49._4_4_ = local_58._4_4_ * fVar34;
            auVar49._8_4_ = local_58._8_4_ * fVar34;
            auVar49._12_4_ = local_58._12_4_ * fVar34;
          }
          auVar64 = vmovshdup_avx(auVar49);
          fVar34 = fVar35 * auVar64._0_4_;
          fVar62 = fVar35 * auVar49._0_4_;
          pIVar10 = this->_VtxWritePtr;
          (pIVar10->pos).x = fVar34 + points[uVar15 - 1].x;
          (pIVar10->pos).y = points[uVar15 - 1].y - fVar62;
          pIVar10->uv = IVar31;
          pIVar10 = this->_VtxWritePtr;
          pIVar10->col = IVar20;
          pIVar10[1].pos.x = fVar34 + points[uVar16].x;
          pIVar10[1].pos.y = points[uVar16].y - fVar62;
          pIVar10[1].uv = IVar31;
          pIVar10 = this->_VtxWritePtr;
          pIVar10[1].col = IVar20;
          pIVar10[2].pos.x = points[uVar16].x - fVar34;
          pIVar10[2].pos.y = fVar62 + points[uVar16].y;
          pIVar10[2].uv = IVar31;
          pIVar10 = this->_VtxWritePtr;
          pIVar10[2].col = IVar20;
          pIVar10[3].pos.x = points[uVar15 - 1].x - fVar34;
          pIVar10[3].pos.y = fVar62 + points[uVar15 - 1].y;
          pIVar10[3].uv = IVar31;
          pIVar10 = this->_VtxWritePtr;
          pIVar10[3].col = IVar20;
          this->_VtxWritePtr = pIVar10 + 4;
          uVar29 = this->_VtxCurrentIdx;
          pIVar24 = this->_IdxWritePtr;
          IVar12 = (ImDrawIdx)uVar29;
          *pIVar24 = IVar12;
          pIVar24[1] = IVar12 + 1;
          pIVar24[2] = IVar12 + 2;
          pIVar24[3] = IVar12;
          pIVar24[4] = IVar12 + 2;
          pIVar24[5] = IVar12 + 3;
          this->_IdxWritePtr = pIVar24 + 6;
          this->_VtxCurrentIdx = uVar29 + 4;
          bVar33 = uVar15 != uVar13;
          uVar15 = uVar15 + 1;
        } while (bVar33);
      }
    }
    else {
      auVar64 = vmaxss_avx(auVar44._0_16_,SUB6416(ZEXT464(0x3f800000),0));
      local_44 = auVar64._0_4_;
      local_74 = (int)local_44;
      fVar35 = this->_FringeScale;
      local_31 = fVar35 == 1.0 & local_74 < 0x3f & (byte)this->Flags >> 1 &
                 local_44 - (float)local_74 <= 1e-05;
      iVar32 = 0x12;
      if (thickness <= fVar35) {
        iVar32 = 0xc;
      }
      iVar21 = 6;
      if (local_31 == 0) {
        iVar21 = iVar32;
      }
      local_a8 = ZEXT416((uint)fVar35);
      if (local_31 == 1) {
        local_78 = points_count * 2;
        iVar32 = 3;
      }
      else {
        local_78 = points_count * 3;
        if (fVar35 < thickness) {
          local_78 = points_count * 4;
        }
        iVar32 = (uint)(fVar35 < thickness) * 2 + 3;
      }
      uStack_d0 = 0x187f44;
      local_70 = (ulong)uVar13;
      PrimReserve(this,iVar21 * uVar13,local_78);
      lVar26 = -((ulong)(uint)(iVar32 * points_count) * 8 + 0xf & 0xfffffffffffffff0);
      puVar27 = (undefined8 *)(local_c8 + lVar26);
      local_68 = (ulong)(uint)points_count;
      uVar15 = (ulong)(uint)points_count;
      local_58._0_8_ = puVar27;
      local_40 = uVar15;
      IVar20 = local_38;
      if (0 < (int)local_70) {
        uVar22 = local_70 & 0xffffffff;
        uVar13 = 0x80000000;
        local_b8 = 0x80000000;
        uStack_b4 = 0x80000000;
        uStack_b0 = 0x80000000;
        uStack_ac = 0x80000000;
        uVar16 = 1;
        do {
          uVar14 = uVar16;
          if (uVar15 == uVar16) {
            uVar14 = 0;
          }
          auVar38._8_8_ = 0;
          auVar38._0_4_ = points[uVar14].x;
          auVar38._4_4_ = points[uVar14].y;
          auVar46._8_8_ = 0;
          auVar46._0_4_ = points[uVar16 - 1].x;
          auVar46._4_4_ = points[uVar16 - 1].y;
          local_c8 = vsubps_avx(auVar38,auVar46);
          fVar35 = local_c8._0_4_;
          auVar39._0_4_ = fVar35 * fVar35;
          auVar39._4_4_ = local_c8._4_4_ * local_c8._4_4_;
          auVar39._8_4_ = local_c8._8_4_ * local_c8._8_4_;
          auVar39._12_4_ = local_c8._12_4_ * local_c8._12_4_;
          auVar64 = vmovshdup_avx(auVar39);
          fVar35 = fVar35 * fVar35 + auVar64._0_4_;
          auVar64 = local_c8;
          if (0.0 < fVar35) {
            if (fVar35 < 0.0) {
              *(undefined8 *)(local_c8 + lVar26 + -8) = 0x187fec;
              fVar35 = sqrtf(fVar35);
              puVar27 = (undefined8 *)local_58._0_8_;
              uVar15 = local_40;
              IVar20 = local_38;
              uVar13 = local_b8;
            }
            else {
              auVar64 = vsqrtss_avx(ZEXT416((uint)fVar35),ZEXT416((uint)fVar35));
              fVar35 = auVar64._0_4_;
            }
            fVar35 = 1.0 / fVar35;
            auVar64._0_4_ = local_c8._0_4_ * fVar35;
            auVar64._4_4_ = local_c8._4_4_ * fVar35;
            auVar64._8_4_ = local_c8._8_4_ * fVar35;
            auVar64._12_4_ = local_c8._12_4_ * fVar35;
          }
          uVar9 = vextractps_avx(auVar64,1);
          *(undefined4 *)(puVar27 + (uVar16 - 1)) = uVar9;
          *(uint *)((long)puVar27 + uVar16 * 8 + -4) = auVar64._0_4_ ^ uVar13;
          bVar33 = uVar16 != uVar22;
          uVar16 = uVar16 + 1;
        } while (bVar33);
      }
      auVar64 = _DAT_001ed820;
      pauVar1 = (undefined1 (*) [32])(puVar27 + uVar15);
      cVar23 = (char)local_7c;
      if (cVar23 == '\0') {
        puVar27[local_60 & 0xffffffff] = *(undefined8 *)((long)pauVar1[-1] + 0x10);
      }
      uVar13 = IVar20 & 0xffffff;
      if ((local_48 <= (float)local_a8._0_4_ | local_31) == 1) {
        fVar35 = (float)local_a8._0_4_;
        if (local_31 != 0) {
          fVar35 = local_44 * 0.5 + 1.0;
        }
        if (cVar23 == '\0') {
          auVar40._0_4_ = fVar35 * (float)*puVar27;
          auVar40._4_4_ = fVar35 * (float)((ulong)*puVar27 >> 0x20);
          auVar40._8_4_ = fVar35 * 0.0;
          auVar40._12_4_ = fVar35 * 0.0;
          IVar5 = *points;
          auVar50._8_8_ = 0;
          auVar50._0_4_ = IVar5.x;
          auVar50._4_4_ = IVar5.y;
          auVar58._0_4_ = auVar40._0_4_ + IVar5.x;
          auVar58._4_4_ = auVar40._4_4_ + IVar5.y;
          auVar58._8_4_ = auVar40._8_4_ + 0.0;
          auVar58._12_4_ = auVar40._12_4_ + 0.0;
          auVar64 = vsubps_avx(auVar50,auVar40);
          auVar64 = vmovlhps_avx(auVar58,auVar64);
          *(undefined1 (*) [16])*pauVar1 = auVar64;
          uVar15 = local_60 & 0xffffffff;
          IVar5 = points[uVar15];
          auVar51._8_8_ = 0;
          auVar51._0_4_ = IVar5.x;
          auVar51._4_4_ = IVar5.y;
          auVar41._0_4_ = fVar35 * (float)puVar27[uVar15] + IVar5.x;
          auVar41._4_4_ = fVar35 * (float)((ulong)puVar27[uVar15] >> 0x20) + IVar5.y;
          auVar41._8_4_ = fVar35 * 0.0 + 0.0;
          auVar41._12_4_ = fVar35 * 0.0 + 0.0;
          uVar16 = (ulong)(uint)((int)local_60 * 2);
          uVar57 = vmovlps_avx(auVar41);
          *(undefined8 *)((long)*pauVar1 + uVar16 * 8) = uVar57;
          auVar42._0_4_ = fVar35 * (float)puVar27[uVar15];
          auVar42._4_4_ = fVar35 * (float)((ulong)puVar27[uVar15] >> 0x20);
          auVar42._8_4_ = fVar35 * 0.0;
          auVar42._12_4_ = fVar35 * 0.0;
          auVar64 = vsubps_avx(auVar51,auVar42);
          uVar57 = vmovlps_avx(auVar64);
          *(undefined8 *)((long)*pauVar1 + (uVar16 + 1) * 8) = uVar57;
        }
        if (0 < (int)local_70) {
          uVar17 = (uint)local_31;
          pIVar24 = this->_IdxWritePtr;
          uVar15 = 1;
          uVar29 = this->_VtxCurrentIdx;
          do {
            uVar16 = uVar15 & 0xffffffff;
            if (local_40 == uVar15) {
              uVar16 = 0;
            }
            uVar30 = uVar29 + (uVar17 ^ 3);
            if (local_40 == uVar15) {
              uVar30 = this->_VtxCurrentIdx;
            }
            uVar57 = *(undefined8 *)(local_58._0_8_ + -8 + uVar15 * 8);
            uVar6 = *(undefined8 *)(local_58._0_8_ + uVar16 * 8);
            fVar34 = ((float)uVar57 + (float)uVar6) * 0.5;
            fVar62 = ((float)((ulong)uVar57 >> 0x20) + (float)((ulong)uVar6 >> 0x20)) * 0.5;
            auVar65._0_4_ = fVar34 * fVar34;
            auVar65._4_4_ = fVar62 * fVar62;
            auVar65._8_8_ = 0;
            auVar64 = vmovshdup_avx(auVar65);
            IVar5 = points[uVar16];
            auVar68._8_4_ = IVar5.x;
            auVar68._12_4_ = IVar5.y;
            auVar68._0_4_ = IVar5.x;
            auVar68._4_4_ = IVar5.y;
            auVar64 = vmaxss_avx(SUB6416(ZEXT464(0x3f000000),0),
                                 ZEXT416((uint)(fVar34 * fVar34 + auVar64._0_4_)));
            fVar63 = 1.0 / auVar64._0_4_;
            fVar34 = fVar35 * fVar34 * fVar63;
            fVar62 = fVar35 * fVar62 * fVar63;
            uVar57 = CONCAT44(fVar62,fVar34);
            auVar66._8_8_ = uVar57;
            auVar66._0_8_ = uVar57;
            auVar64 = vsubps_avx(auVar68,auVar66);
            *(undefined8 *)((long)*pauVar1 + (ulong)(uint)((int)uVar16 * 2) * 8) =
                 CONCAT44(IVar5.y + fVar62,IVar5.x + fVar34);
            ((undefined8 *)((long)*pauVar1 + (ulong)(uint)((int)uVar16 * 2) * 8))[1] = auVar64._8_8_
            ;
            IVar28 = (ImDrawIdx)uVar30;
            *pIVar24 = IVar28;
            IVar12 = (ImDrawIdx)uVar29;
            pIVar24[1] = IVar12;
            if (local_31 == 0) {
              pIVar24[2] = IVar12 + 2;
              pIVar24[3] = IVar12 + 2;
              pIVar24[4] = IVar28 + 2;
              pIVar24[5] = IVar28;
              pIVar24[6] = IVar28 + 1;
              pIVar24[7] = IVar12 + 1;
              pIVar24[8] = IVar12;
              pIVar24[9] = IVar12;
              pIVar24[10] = IVar28;
              pIVar24[0xb] = IVar28 + 1;
              lVar26 = 0x18;
            }
            else {
              pIVar24[2] = IVar12 + 1;
              pIVar24[3] = IVar28 + 1;
              pIVar24[4] = IVar12 + 1;
              pIVar24[5] = IVar28;
              lVar26 = 0xc;
            }
            pIVar24 = (ImDrawIdx *)((long)pIVar24 + lVar26);
            this->_IdxWritePtr = pIVar24;
            bVar33 = uVar15 != (local_70 & 0xffffffff);
            uVar15 = uVar15 + 1;
            uVar29 = uVar30;
          } while (bVar33);
        }
        if (local_31 == 0) {
          uVar15 = 1;
          if (1 < (int)local_68) {
            uVar15 = local_68 & 0xffffffff;
          }
          lVar26 = local_58._0_8_ + local_40 * 8;
          lVar18 = 0;
          do {
            this->_VtxWritePtr->pos = *(ImVec2 *)((long)&points->x + lVar18);
            this->_VtxWritePtr->uv = IVar31;
            pIVar10 = this->_VtxWritePtr;
            pIVar10->col = local_38;
            pIVar10[1].pos = *(ImVec2 *)(lVar26 + lVar18 * 2);
            this->_VtxWritePtr[1].uv = IVar31;
            pIVar10 = this->_VtxWritePtr;
            pIVar10[1].col = uVar13;
            pIVar10[2].pos = *(ImVec2 *)(lVar26 + 8 + lVar18 * 2);
            this->_VtxWritePtr[2].uv = IVar31;
            pIVar10 = this->_VtxWritePtr;
            pIVar10[2].col = uVar13;
            this->_VtxWritePtr = pIVar10 + 3;
            lVar18 = lVar18 + 8;
          } while (uVar15 * 8 != lVar18);
        }
        else {
          uVar15 = 1;
          if (1 < (int)local_68) {
            uVar15 = local_68 & 0xffffffff;
          }
          pIVar11 = this->_Data->TexUvLines;
          pIVar2 = pIVar11 + local_74;
          uVar3 = pIVar2->x;
          uVar7 = pIVar2->y;
          auVar43._4_4_ = uVar7;
          auVar43._0_4_ = uVar3;
          auVar43._8_8_ = 0;
          pIVar11 = pIVar11 + local_74;
          uVar4 = pIVar11->z;
          uVar8 = pIVar11->w;
          auVar47._4_4_ = uVar8;
          auVar47._0_4_ = uVar4;
          auVar47._8_8_ = 0;
          lVar26 = local_58._0_8_ + local_40 * 8;
          lVar18 = 0;
          do {
            this->_VtxWritePtr->pos = *(ImVec2 *)(lVar26 + lVar18);
            IVar31 = (ImVec2)vmovlps_avx(auVar43);
            this->_VtxWritePtr->uv = IVar31;
            pIVar10 = this->_VtxWritePtr;
            pIVar10->col = local_38;
            pIVar10[1].pos = *(ImVec2 *)(lVar26 + 8 + lVar18);
            IVar31 = (ImVec2)vmovlps_avx(auVar47);
            this->_VtxWritePtr[1].uv = IVar31;
            pIVar10 = this->_VtxWritePtr;
            pIVar10[1].col = local_38;
            this->_VtxWritePtr = pIVar10 + 2;
            lVar18 = lVar18 + 0x10;
          } while (uVar15 * 0x10 != lVar18);
        }
      }
      else {
        fVar35 = (local_44 - (float)local_a8._0_4_) * 0.5;
        if (cVar23 == '\0') {
          fVar34 = (float)local_a8._0_4_ + fVar35;
          fVar62 = (float)*puVar27;
          auVar59._0_4_ = fVar34 * fVar62;
          fVar63 = (float)((ulong)*puVar27 >> 0x20);
          auVar59._4_4_ = fVar34 * fVar63;
          auVar59._8_4_ = fVar34 * 0.0;
          auVar59._12_4_ = fVar34 * 0.0;
          IVar5 = *points;
          auVar67._8_8_ = 0;
          auVar67._0_4_ = IVar5.x;
          auVar67._4_4_ = IVar5.y;
          auVar56._4_4_ = auVar59._4_4_ + IVar5.y;
          auVar56._0_4_ = auVar59._0_4_ + IVar5.x;
          auVar56._8_4_ = auVar59._8_4_ + 0.0;
          auVar56._12_4_ = auVar59._12_4_ + 0.0;
          auVar52._0_4_ = fVar35 * fVar62;
          auVar52._4_4_ = fVar35 * fVar63;
          auVar52._8_4_ = fVar35 * 0.0;
          auVar52._12_4_ = fVar35 * 0.0;
          auVar61._4_4_ = auVar52._4_4_ + IVar5.y;
          auVar61._0_4_ = auVar52._0_4_ + IVar5.x;
          auVar61._8_4_ = auVar52._8_4_ + 0.0;
          auVar61._12_4_ = auVar52._12_4_ + 0.0;
          auVar38 = vsubps_avx(auVar67,auVar59);
          auVar61._16_16_ = auVar38;
          auVar38 = vsubps_avx(auVar67,auVar52);
          auVar56._16_16_ = auVar38;
          auVar56 = vunpcklpd_avx(auVar56,auVar61);
          *pauVar1 = auVar56;
          uVar16 = local_60 & 0xffffffff;
          IVar5 = points[uVar16];
          auVar60._8_8_ = 0;
          auVar60._0_4_ = IVar5.x;
          auVar60._4_4_ = IVar5.y;
          auVar53._0_4_ = fVar34 * (float)puVar27[uVar16] + IVar5.x;
          auVar53._4_4_ = fVar34 * (float)((ulong)puVar27[uVar16] >> 0x20) + IVar5.y;
          auVar53._8_4_ = fVar34 * 0.0 + 0.0;
          auVar53._12_4_ = fVar34 * 0.0 + 0.0;
          uVar22 = (ulong)(uint)((int)local_60 << 2);
          uVar57 = vmovlps_avx(auVar53);
          *(undefined8 *)((long)*pauVar1 + uVar22 * 8) = uVar57;
          auVar54._0_4_ = IVar5.x + fVar35 * (float)puVar27[uVar16];
          auVar54._4_4_ = IVar5.y + fVar35 * (float)((ulong)puVar27[uVar16] >> 0x20);
          auVar54._8_4_ = fVar35 * 0.0 + 0.0;
          auVar54._12_4_ = fVar35 * 0.0 + 0.0;
          uVar57 = vmovlps_avx(auVar54);
          *(undefined8 *)((long)*pauVar1 + (uVar22 + 1) * 8) = uVar57;
          auVar55._0_4_ = fVar35 * (float)puVar27[uVar16];
          auVar55._4_4_ = fVar35 * (float)((ulong)puVar27[uVar16] >> 0x20);
          auVar55._8_4_ = fVar35 * 0.0;
          auVar55._12_4_ = fVar35 * 0.0;
          auVar38 = vsubps_avx(auVar60,auVar55);
          uVar57 = vmovlps_avx(auVar38);
          *(undefined8 *)((long)*pauVar1 + (uVar22 + 2) * 8) = uVar57;
          auVar48._0_4_ = fVar34 * (float)puVar27[uVar16];
          auVar48._4_4_ = fVar34 * (float)((ulong)puVar27[uVar16] >> 0x20);
          auVar48._8_4_ = fVar34 * 0.0;
          auVar48._12_4_ = fVar34 * 0.0;
          auVar38 = vsubps_avx(auVar60,auVar48);
          uVar57 = vmovlps_avx(auVar38);
          *(undefined8 *)((long)*pauVar1 + (uVar22 + 3) * 8) = uVar57;
        }
        if (0 < (int)local_70) {
          pauVar19 = (undefined1 (*) [16])this->_IdxWritePtr;
          auVar38 = vshufps_avx(ZEXT416((uint)((float)local_a8._0_4_ + fVar35)),
                                ZEXT416((uint)fVar35),0);
          uVar16 = 1;
          uVar29 = this->_VtxCurrentIdx;
          do {
            uVar22 = uVar16 & 0xffffffff;
            if (uVar15 == uVar16) {
              uVar22 = 0;
            }
            fVar35 = ((float)puVar27[uVar16 - 1] + (float)puVar27[uVar22]) * 0.5;
            fVar34 = ((float)((ulong)puVar27[uVar16 - 1] >> 0x20) +
                     (float)((ulong)puVar27[uVar22] >> 0x20)) * 0.5;
            auVar71._0_4_ = fVar35 * fVar35;
            auVar71._4_4_ = fVar34 * fVar34;
            auVar71._8_8_ = 0;
            auVar39 = vmovshdup_avx(auVar71);
            uVar17 = uVar29 + 4;
            if (uVar15 == uVar16) {
              uVar17 = this->_VtxCurrentIdx;
            }
            IVar5 = points[uVar22];
            auVar72._8_4_ = IVar5.x;
            auVar72._12_4_ = IVar5.y;
            auVar72._0_4_ = IVar5.x;
            auVar72._4_4_ = IVar5.y;
            auVar72._16_4_ = IVar5.x;
            auVar72._20_4_ = IVar5.y;
            auVar72._24_4_ = IVar5.x;
            auVar72._28_4_ = IVar5.y;
            auVar39 = vmaxss_avx(SUB6416(ZEXT464(0x3f000000),0),
                                 ZEXT416((uint)(fVar35 * fVar35 + auVar39._0_4_)));
            fVar70 = 1.0 / auVar39._0_4_;
            fVar62 = auVar38._0_4_ * fVar35 * fVar70;
            fVar63 = auVar38._4_4_ * fVar34 * fVar70;
            fVar35 = auVar38._8_4_ * fVar35 * fVar70;
            fVar34 = auVar38._12_4_ * fVar34 * fVar70;
            auVar56 = vpermpd_avx2(ZEXT1632(CONCAT412(fVar34,CONCAT48(fVar35,CONCAT44(fVar63,fVar62)
                                                                     ))),0x14);
            fVar70 = IVar5.x;
            auVar69._0_4_ = fVar70 + fVar62;
            fVar62 = IVar5.y;
            auVar69._4_4_ = fVar62 + fVar63;
            auVar69._8_4_ = fVar70 + fVar35;
            auVar69._12_4_ = fVar62 + fVar34;
            auVar69._16_4_ = fVar70 + 0.0;
            auVar69._20_4_ = fVar62 + 0.0;
            auVar69._24_4_ = fVar70 + 0.0;
            auVar69._28_4_ = fVar62 + 0.0;
            auVar56 = vsubps_avx(auVar72,auVar56);
            auVar56 = vblendps_avx(auVar69,auVar56,0xf0);
            auVar39 = vpinsrw_avx(ZEXT416(uVar17),uVar29,1);
            auVar39 = vpshuflw_avx(auVar39,0x14);
            *(undefined1 (*) [32])((long)*pauVar1 + (ulong)(uint)((int)uVar22 << 2) * 8) = auVar56;
            auVar39 = vpaddw_avx(auVar39,ZEXT816(0x2000200010001));
            auVar46 = vpshufb_avx(auVar39,auVar64);
            *pauVar19 = auVar46;
            sVar25 = (short)uVar29;
            *(short *)pauVar19[1] = sVar25;
            *(short *)(pauVar19[1] + 2) = sVar25;
            *(short *)(pauVar19[1] + 4) = (short)uVar17;
            auVar46 = vpshuflw_avx(auVar39,0xec);
            *(int *)(pauVar19[1] + 6) = auVar46._0_4_;
            vpextrw_avx(auVar39,2);
            *(short *)(pauVar19[1] + 0xc) = sVar25 + 3;
            *(short *)(pauVar19[1] + 0xe) = sVar25 + 3;
            *(short *)pauVar19[2] = (short)uVar17 + 3;
            vpextrw_avx(auVar39,3);
            pauVar19 = (undefined1 (*) [16])(pauVar19[2] + 4);
            bVar33 = uVar16 != (local_70 & 0xffffffff);
            uVar16 = uVar16 + 1;
            puVar27 = (undefined8 *)local_58._0_8_;
            uVar15 = local_40;
            uVar29 = uVar17;
          } while (bVar33);
          this->_IdxWritePtr = (ImDrawIdx *)pauVar19;
          IVar20 = local_38;
        }
        uVar16 = 1;
        if (1 < (int)local_68) {
          uVar16 = local_68 & 0xffffffff;
        }
        lVar26 = 0;
        do {
          this->_VtxWritePtr->pos = *(ImVec2 *)((long)puVar27 + lVar26 + uVar15 * 8);
          this->_VtxWritePtr->uv = IVar31;
          pIVar10 = this->_VtxWritePtr;
          pIVar10->col = uVar13;
          pIVar10[1].pos = *(ImVec2 *)((long)puVar27 + lVar26 + uVar15 * 8 + 8);
          this->_VtxWritePtr[1].uv = IVar31;
          pIVar10 = this->_VtxWritePtr;
          pIVar10[1].col = IVar20;
          pIVar10[2].pos = *(ImVec2 *)((long)puVar27 + lVar26 + uVar15 * 8 + 0x10);
          this->_VtxWritePtr[2].uv = IVar31;
          pIVar10 = this->_VtxWritePtr;
          pIVar10[2].col = IVar20;
          pIVar10[3].pos = *(ImVec2 *)((long)puVar27 + lVar26 + uVar15 * 8 + 0x18);
          this->_VtxWritePtr[3].uv = IVar31;
          pIVar10 = this->_VtxWritePtr;
          pIVar10[3].col = uVar13;
          this->_VtxWritePtr = pIVar10 + 4;
          lVar26 = lVar26 + 0x20;
        } while (uVar16 * 0x20 != lVar26);
      }
      this->_VtxCurrentIdx = this->_VtxCurrentIdx + (uint)(ushort)local_78;
    }
  }
  return;
}

Assistant:

void ImDrawList::AddPolyline(const ImVec2* points, const int points_count, ImU32 col, bool closed, float thickness)
{
    if (points_count < 2)
        return;

    const ImVec2 opaque_uv = _Data->TexUvWhitePixel;
    const int count = closed ? points_count : points_count - 1; // The number of line segments we need to draw
    const bool thick_line = (thickness > _FringeScale);

    if (Flags & ImDrawListFlags_AntiAliasedLines)
    {
        // Anti-aliased stroke
        const float AA_SIZE = _FringeScale;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;

        // Thicknesses <1.0 should behave like thickness 1.0
        thickness = ImMax(thickness, 1.0f);
        const int integer_thickness = (int)thickness;
        const float fractional_thickness = thickness - integer_thickness;

        // Do we want to draw this line using a texture?
        // - For now, only draw integer-width lines using textures to avoid issues with the way scaling occurs, could be improved.
        // - If AA_SIZE is not 1.0f we cannot use the texture path.
        const bool use_texture = (Flags & ImDrawListFlags_AntiAliasedLinesUseTex) && (integer_thickness < IM_DRAWLIST_TEX_LINES_WIDTH_MAX) && (fractional_thickness <= 0.00001f) && (AA_SIZE == 1.0f);

        // We should never hit this, because NewFrame() doesn't set ImDrawListFlags_AntiAliasedLinesUseTex unless ImFontAtlasFlags_NoBakedLines is off
        IM_ASSERT_PARANOID(!use_texture || !(_Data->Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines));

        const int idx_count = use_texture ? (count * 6) : (thick_line ? count * 18 : count * 12);
        const int vtx_count = use_texture ? (points_count * 2) : (thick_line ? points_count * 4 : points_count * 3);
        PrimReserve(idx_count, vtx_count);

        // Temporary buffer
        // The first <points_count> items are normals at each line point, then after that there are either 2 or 4 temp points for each line point
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * ((use_texture || !thick_line) ? 3 : 5) * sizeof(ImVec2)); //-V630
        ImVec2* temp_points = temp_normals + points_count;

        // Calculate normals (tangents) for each line segment
        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            float dx = points[i2].x - points[i1].x;
            float dy = points[i2].y - points[i1].y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i1].x = dy;
            temp_normals[i1].y = -dx;
        }
        if (!closed)
            temp_normals[points_count - 1] = temp_normals[points_count - 2];

        // If we are drawing a one-pixel-wide line without a texture, or a textured line of any width, we only need 2 or 3 vertices per point
        if (use_texture || !thick_line)
        {
            // [PATH 1] Texture-based lines (thick or non-thick)
            // [PATH 2] Non texture-based lines (non-thick)

            // The width of the geometry we need to draw - this is essentially <thickness> pixels for the line itself, plus "one pixel" for AA.
            // - In the texture-based path, we don't use AA_SIZE here because the +1 is tied to the generated texture
            //   (see ImFontAtlasBuildRenderLinesTexData() function), and so alternate values won't work without changes to that code.
            // - In the non texture-based paths, we would allow AA_SIZE to potentially be != 1.0f with a patch (e.g. fringe_scale patch to
            //   allow scaling geometry while preserving one-screen-pixel AA fringe).
            const float half_draw_size = use_texture ? ((thickness * 0.5f) + 1) : AA_SIZE;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * half_draw_size;
                temp_points[1] = points[0] - temp_normals[0] * half_draw_size;
                temp_points[(points_count-1)*2+0] = points[points_count-1] + temp_normals[points_count-1] * half_draw_size;
                temp_points[(points_count-1)*2+1] = points[points_count-1] - temp_normals[points_count-1] * half_draw_size;
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1; // i2 is the second point of the line segment
                const unsigned int idx2 = ((i1 + 1) == points_count) ? _VtxCurrentIdx : (idx1 + (use_texture ? 2 : 3)); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                dm_x *= half_draw_size; // dm_x, dm_y are offset to the outer edge of the AA area
                dm_y *= half_draw_size;

                // Add temporary vertexes for the outer edges
                ImVec2* out_vtx = &temp_points[i2 * 2];
                out_vtx[0].x = points[i2].x + dm_x;
                out_vtx[0].y = points[i2].y + dm_y;
                out_vtx[1].x = points[i2].x - dm_x;
                out_vtx[1].y = points[i2].y - dm_y;

                if (use_texture)
                {
                    // Add indices for two triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 1); // Right tri
                    _IdxWritePtr[3] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[4] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Left tri
                    _IdxWritePtr += 6;
                }
                else
                {
                    // Add indexes for four triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 2); // Right tri 1
                    _IdxWritePtr[3] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Right tri 2
                    _IdxWritePtr[6] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8] = (ImDrawIdx)(idx1 + 0); // Left tri 1
                    _IdxWritePtr[9] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1); // Left tri 2
                    _IdxWritePtr += 12;
                }

                idx1 = idx2;
            }

            // Add vertexes for each point on the line
            if (use_texture)
            {
                // If we're using textures we only need to emit the left/right edge vertices
                ImVec4 tex_uvs = _Data->TexUvLines[integer_thickness];
                /*if (fractional_thickness != 0.0f) // Currently always zero when use_texture==false!
                {
                    const ImVec4 tex_uvs_1 = _Data->TexUvLines[integer_thickness + 1];
                    tex_uvs.x = tex_uvs.x + (tex_uvs_1.x - tex_uvs.x) * fractional_thickness; // inlined ImLerp()
                    tex_uvs.y = tex_uvs.y + (tex_uvs_1.y - tex_uvs.y) * fractional_thickness;
                    tex_uvs.z = tex_uvs.z + (tex_uvs_1.z - tex_uvs.z) * fractional_thickness;
                    tex_uvs.w = tex_uvs.w + (tex_uvs_1.w - tex_uvs.w) * fractional_thickness;
                }*/
                ImVec2 tex_uv0(tex_uvs.x, tex_uvs.y);
                ImVec2 tex_uv1(tex_uvs.z, tex_uvs.w);
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = temp_points[i * 2 + 0]; _VtxWritePtr[0].uv = tex_uv0; _VtxWritePtr[0].col = col; // Left-side outer edge
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 1]; _VtxWritePtr[1].uv = tex_uv1; _VtxWritePtr[1].col = col; // Right-side outer edge
                    _VtxWritePtr += 2;
                }
            }
            else
            {
                // If we're not using a texture, we need the center vertex as well
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = points[i];              _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;       // Center of line
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 0]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col_trans; // Left-side outer edge
                    _VtxWritePtr[2].pos = temp_points[i * 2 + 1]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col_trans; // Right-side outer edge
                    _VtxWritePtr += 3;
                }
            }
        }
        else
        {
            // [PATH 2] Non texture-based lines (thick): we need to draw the solid line core and thus require four vertices per point
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                const int points_last = points_count - 1;
                temp_points[0] = points[0] + temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[1] = points[0] + temp_normals[0] * (half_inner_thickness);
                temp_points[2] = points[0] - temp_normals[0] * (half_inner_thickness);
                temp_points[3] = points[0] - temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 0] = points[points_last] + temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 1] = points[points_last] + temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 2] = points[points_last] - temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 3] = points[points_last] - temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : (i1 + 1); // i2 is the second point of the line segment
                const unsigned int idx2 = (i1 + 1) == points_count ? _VtxCurrentIdx : (idx1 + 4); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                float dm_out_x = dm_x * (half_inner_thickness + AA_SIZE);
                float dm_out_y = dm_y * (half_inner_thickness + AA_SIZE);
                float dm_in_x = dm_x * half_inner_thickness;
                float dm_in_y = dm_y * half_inner_thickness;

                // Add temporary vertices
                ImVec2* out_vtx = &temp_points[i2 * 4];
                out_vtx[0].x = points[i2].x + dm_out_x;
                out_vtx[0].y = points[i2].y + dm_out_y;
                out_vtx[1].x = points[i2].x + dm_in_x;
                out_vtx[1].y = points[i2].y + dm_in_y;
                out_vtx[2].x = points[i2].x - dm_in_x;
                out_vtx[2].y = points[i2].y - dm_in_y;
                out_vtx[3].x = points[i2].x - dm_out_x;
                out_vtx[3].y = points[i2].y - dm_out_y;

                // Add indexes
                _IdxWritePtr[0]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[1]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[2]  = (ImDrawIdx)(idx1 + 2);
                _IdxWritePtr[3]  = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4]  = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5]  = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[6]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8]  = (ImDrawIdx)(idx1 + 0);
                _IdxWritePtr[9]  = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[12] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[13] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[14] = (ImDrawIdx)(idx1 + 3);
                _IdxWritePtr[15] = (ImDrawIdx)(idx1 + 3); _IdxWritePtr[16] = (ImDrawIdx)(idx2 + 3); _IdxWritePtr[17] = (ImDrawIdx)(idx2 + 2);
                _IdxWritePtr += 18;

                idx1 = idx2;
            }

            // Add vertices
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = temp_points[i * 4 + 0]; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col_trans;
                _VtxWritePtr[1].pos = temp_points[i * 4 + 1]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
                _VtxWritePtr[2].pos = temp_points[i * 4 + 2]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
                _VtxWritePtr[3].pos = temp_points[i * 4 + 3]; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col_trans;
                _VtxWritePtr += 4;
            }
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // [PATH 4] Non texture-based, Non anti-aliased lines
        const int idx_count = count * 6;
        const int vtx_count = count * 4;    // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            const ImVec2& p1 = points[i1];
            const ImVec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= (thickness * 0.5f);
            dy *= (thickness * 0.5f);

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = p2.x + dy; _VtxWritePtr[1].pos.y = p2.y - dx; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
            _VtxWritePtr[2].pos.x = p2.x - dy; _VtxWritePtr[2].pos.y = p2.y + dx; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
            _VtxWritePtr[3].pos.x = p1.x - dy; _VtxWritePtr[3].pos.y = p1.y + dx; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col;
            _VtxWritePtr += 4;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + 1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + 2);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx + 2); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx + 3);
            _IdxWritePtr += 6;
            _VtxCurrentIdx += 4;
        }
    }
}